

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
PathNode::Evaluate(string *__return_storage_ptr__,PathNode *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *parameters,cmGeneratorExpressionContext *context,
                  GeneratorExpressionContent *content,cmGeneratorExpressionDAGChecker *param_4)

{
  allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>
  *this_00;
  initializer_list<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>
  __l;
  GeneratorExpressionContent *context_00;
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  mapped_type *this_01;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  *local_bc0;
  cmAlphaNum local_908;
  cmAlphaNum local_8d8;
  string local_8a8;
  string local_888;
  key_type local_868;
  Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_858;
  undefined1 local_848 [8];
  Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  string_view local_830;
  anon_class_1_0_00000001 local_819;
  string_view local_818;
  anon_class_1_0_00000001 local_801;
  string_view local_800;
  anon_class_1_0_00000001 local_7e9;
  string_view local_7e8;
  anon_class_1_0_00000001 local_7d1;
  string_view local_7d0;
  anon_class_1_0_00000001 local_7b9;
  string_view local_7b8;
  anon_class_1_0_00000001 local_7a1;
  string_view local_7a0;
  anon_class_1_0_00000001 local_789;
  string_view local_788;
  anon_class_1_0_00000001 local_771;
  string_view local_770;
  anon_class_1_0_00000001 local_759;
  string_view local_758;
  anon_class_1_0_00000001 local_741;
  string_view local_740;
  anon_class_1_0_00000001 local_729;
  string_view local_728;
  anon_class_1_0_00000001 local_711;
  string_view local_710;
  anon_class_1_0_00000001 local_6f9;
  string_view local_6f8;
  anon_class_1_0_00000001 local_6e1;
  string_view local_6e0;
  anon_class_1_0_00000001 local_6c9;
  string_view local_6c8;
  anon_class_1_0_00000001 local_6b1;
  string_view local_6b0;
  anon_class_1_0_00000001 local_699;
  string_view local_698;
  anon_class_1_0_00000001 local_681;
  string_view local_680;
  anon_class_1_0_00000001 local_669;
  string_view local_668;
  anon_class_1_0_00000001 local_651;
  string_view local_650;
  anon_class_1_0_00000001 local_639;
  string_view local_638;
  anon_class_1_0_00000001 local_621;
  string_view local_620;
  anon_class_1_0_00000001 local_609;
  string_view local_608;
  anon_class_1_0_00000001 local_5f1;
  string_view local_5f0;
  anon_class_1_0_00000001 local_5d9;
  string_view local_5d8;
  anon_class_1_0_00000001 local_5c1;
  string_view local_5c0;
  anon_class_1_0_00000001 local_5ad [13];
  string_view local_5a0;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  *local_590;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_588;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_558;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_528;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_4f8;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_4c8;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_498;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_468;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_438;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_408;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_3d8;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_3a8;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_378;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_348;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_318;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_2e8;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_2b8;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_288;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_258;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_228;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_1f8;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_1c8;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_198;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_168;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_138;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_108;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_d8;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_a8;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
  local_78;
  undefined1 local_48 [24];
  cmGeneratorExpressionDAGChecker *param_33_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  PathNode *this_local;
  
  local_48._16_8_ = param_4;
  param_33_local = (cmGeneratorExpressionDAGChecker *)content;
  content_local = (GeneratorExpressionContent *)context;
  context_local = (cmGeneratorExpressionContext *)parameters;
  parameters_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (PathNode *)__return_storage_ptr__;
  if (Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
      ::pathCommands_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                 ::pathCommands_abi_cxx11_);
    if (iVar2 != 0) {
      local_590 = &local_588;
      local_5a0 = (string_view)::cm::operator____s("GET_ROOT_NAME",0xd);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:696:11),_true>
                (&local_588,(static_string_view *)&local_5a0,local_5ad);
      local_590 = &local_558;
      local_5c0 = (string_view)::cm::operator____s("GET_ROOT_DIRECTORY",0x12);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:705:11),_true>
                (&local_558,(static_string_view *)&local_5c0,&local_5c1);
      local_590 = &local_528;
      local_5d8 = (string_view)::cm::operator____s("GET_ROOT_PATH",0xd);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:715:11),_true>
                (&local_528,(static_string_view *)&local_5d8,&local_5d9);
      local_590 = &local_4f8;
      local_5f0 = (string_view)::cm::operator____s("GET_FILENAME",0xc);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:724:11),_true>
                (&local_4f8,(static_string_view *)&local_5f0,&local_5f1);
      local_590 = &local_4c8;
      local_608 = (string_view)::cm::operator____s("GET_EXTENSION",0xd);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:733:11),_true>
                (&local_4c8,(static_string_view *)&local_608,&local_609);
      local_590 = &local_498;
      local_620 = (string_view)::cm::operator____s("GET_STEM",8);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:754:11),_true>
                (&local_498,(static_string_view *)&local_620,&local_621);
      local_590 = &local_468;
      local_638 = (string_view)::cm::operator____s("GET_RELATIVE_PART",0x11);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:774:11),_true>
                (&local_468,(static_string_view *)&local_638,&local_639);
      local_590 = &local_438;
      local_650 = (string_view)::cm::operator____s("GET_PARENT_PATH",0xf);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:784:11),_true>
                (&local_438,(static_string_view *)&local_650,&local_651);
      local_590 = &local_408;
      local_668 = (string_view)::cm::operator____s("HAS_ROOT_NAME",0xd);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:792:11),_true>
                (&local_408,(static_string_view *)&local_668,&local_669);
      local_590 = &local_3d8;
      local_680 = (string_view)::cm::operator____s("HAS_ROOT_DIRECTORY",0x12);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:800:11),_true>
                (&local_3d8,(static_string_view *)&local_680,&local_681);
      local_590 = &local_3a8;
      local_698 = (string_view)::cm::operator____s("HAS_ROOT_PATH",0xd);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:808:11),_true>
                (&local_3a8,(static_string_view *)&local_698,&local_699);
      local_590 = &local_378;
      local_6b0 = (string_view)::cm::operator____s("HAS_FILENAME",0xc);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:816:11),_true>
                (&local_378,(static_string_view *)&local_6b0,&local_6b1);
      local_590 = &local_348;
      local_6c8 = (string_view)::cm::operator____s("HAS_EXTENSION",0xd);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:824:11),_true>
                (&local_348,(static_string_view *)&local_6c8,&local_6c9);
      local_590 = &local_318;
      local_6e0 = (string_view)::cm::operator____s("HAS_STEM",8);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:833:11),_true>
                (&local_318,(static_string_view *)&local_6e0,&local_6e1);
      local_590 = &local_2e8;
      local_6f8 = (string_view)::cm::operator____s("HAS_RELATIVE_PART",0x11);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:841:11),_true>
                (&local_2e8,(static_string_view *)&local_6f8,&local_6f9);
      local_590 = &local_2b8;
      local_710 = (string_view)::cm::operator____s("HAS_PARENT_PATH",0xf);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:849:11),_true>
                (&local_2b8,(static_string_view *)&local_710,&local_711);
      local_590 = &local_288;
      local_728 = (string_view)::cm::operator____s("IS_ABSOLUTE",0xb);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:857:11),_true>
                (&local_288,(static_string_view *)&local_728,&local_729);
      local_590 = &local_258;
      local_740 = (string_view)::cm::operator____s("IS_RELATIVE",0xb);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:865:11),_true>
                (&local_258,(static_string_view *)&local_740,&local_741);
      local_590 = &local_228;
      local_758 = (string_view)::cm::operator____s("IS_PREFIX",9);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:873:11),_true>
                (&local_228,(static_string_view *)&local_758,&local_759);
      local_590 = &local_1f8;
      local_770 = (string_view)::cm::operator____s("CMAKE_PATH",10);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:894:11),_true>
                (&local_1f8,(static_string_view *)&local_770,&local_771);
      local_590 = &local_1c8;
      local_788 = (string_view)::cm::operator____s("APPEND",6);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:913:11),_true>
                (&local_1c8,(static_string_view *)&local_788,&local_789);
      local_590 = &local_198;
      local_7a0 = (string_view)::cm::operator____s("REMOVE_FILENAME",0xf);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:927:11),_true>
                (&local_198,(static_string_view *)&local_7a0,&local_7a1);
      local_590 = &local_168;
      local_7b8 = (string_view)::cm::operator____s("REPLACE_FILENAME",0x10);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:936:11),_true>
                (&local_168,(static_string_view *)&local_7b8,&local_7b9);
      local_590 = &local_138;
      local_7d0 = (string_view)::cm::operator____s("REMOVE_EXTENSION",0x10);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:946:11),_true>
                (&local_138,(static_string_view *)&local_7d0,&local_7d1);
      local_590 = &local_108;
      local_7e8 = (string_view)::cm::operator____s("REPLACE_EXTENSION",0x11);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:967:11),_true>
                (&local_108,(static_string_view *)&local_7e8,&local_7e9);
      local_590 = &local_d8;
      local_800 = (string_view)::cm::operator____s("NORMAL_PATH",0xb);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:991:11),_true>
                (&local_d8,(static_string_view *)&local_800,&local_801);
      local_590 = &local_a8;
      local_818 = (string_view)::cm::operator____s("RELATIVE_PATH",0xd);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:1000:11),_true>
                (&local_a8,(static_string_view *)&local_818,&local_819);
      local_590 = &local_78;
      local_830 = (string_view)::cm::operator____s("ABSOLUTE_PATH",0xd);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
      ::
      pair<cm::static_string_view,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_JKorbelRA[P]CMake_Source_cmGeneratorExpressionNode_cxx:1008:11),_true>
                (&local_78,(static_string_view *)&local_830,
                 (anon_class_1_0_00000001 *)
                 ((long)&args.
                         super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .End._M_current + 7));
      local_48._0_8_ = &local_588;
      local_48._8_8_ = (char *)0x1c;
      this_00 = (allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>
                 *)((long)&args.
                           super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           .End._M_current + 4);
      std::
      allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>
      ::allocator(this_00);
      __l._M_len = local_48._8_8_;
      __l._M_array = (iterator)local_48._0_8_;
      std::
      unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>_>
      ::unordered_map(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                       ::pathCommands_abi_cxx11_,__l,0,
                      (hasher *)
                      ((long)&args.
                              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .End._M_current + 6),
                      (key_equal *)
                      ((long)&args.
                              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .End._M_current + 5),this_00);
      std::
      allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>
      ::~allocator((allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>
                    *)((long)&args.
                              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .End._M_current + 4));
      local_bc0 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
                   *)local_48;
      do {
        local_bc0 = local_bc0 + -1;
        std::
        pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>
        ::~pair(local_bc0);
      } while (local_bc0 != &local_588);
      __cxa_atexit(std::
                   unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>_>
                   ::~unordered_map,
                   &Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                    ::pathCommands_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                           ::pathCommands_abi_cxx11_);
    }
  }
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)context_local);
  bVar1 = ::cm::
          contains<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                      ::pathCommands_abi_cxx11_,pvVar3);
  context_00 = content_local;
  if (bVar1) {
    anon_unknown.dwarf_138e8bc::
    Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::Range(&local_858,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)context_local);
    _local_848 = (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  )anon_unknown.dwarf_138e8bc::
                   Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::advance(&local_858,1);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)context_local);
    local_868 = (key_type)std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar3)
    ;
    this_01 = std::
              unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>_>_>_>
              ::operator[](&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                            ::pathCommands_abi_cxx11_,&local_868);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(cmGeneratorExpressionContext_*,_const_GeneratorExpressionContent_*,_(anonymous_namespace)::Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
    ::operator()(__return_storage_ptr__,this_01,(cmGeneratorExpressionContext *)content_local,
                 (GeneratorExpressionContent *)param_33_local,
                 (Range<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_848);
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_888,(GeneratorExpressionContent *)param_33_local);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)context_local);
    cmAlphaNum::cmAlphaNum(&local_8d8,pvVar3);
    cmAlphaNum::cmAlphaNum(&local_908,": invalid option.");
    cmStrCat<>(&local_8a8,&local_8d8,&local_908);
    reportError((cmGeneratorExpressionContext *)context_00,&local_888,&local_8a8);
    std::__cxx11::string::~string((string *)&local_8a8);
    std::__cxx11::string::~string((string *)&local_888);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    static std::unordered_map<
      cm::string_view,
      std::function<std::string(cmGeneratorExpressionContext*,
                                const GeneratorExpressionContent*,
                                Arguments&)>>
      pathCommands{
        { "GET_ROOT_NAME"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "GET_ROOT_NAME"_s, args) &&
                !args.front().empty()
              ? cmCMakePath{ args.front() }.GetRootName().String()
              : std::string{};
          } },
        { "GET_ROOT_DIRECTORY"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "GET_ROOT_DIRECTORY"_s,
                                       args) &&
                !args.front().empty()
              ? cmCMakePath{ args.front() }.GetRootDirectory().String()
              : std::string{};
          } },
        { "GET_ROOT_PATH"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "GET_ROOT_PATH"_s, args) &&
                !args.front().empty()
              ? cmCMakePath{ args.front() }.GetRootPath().String()
              : std::string{};
          } },
        { "GET_FILENAME"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "GET_FILENAME"_s, args) &&
                !args.front().empty()
              ? cmCMakePath{ args.front() }.GetFileName().String()
              : std::string{};
          } },
        { "GET_EXTENSION"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            bool lastOnly = args.front() == "LAST_ONLY"_s;
            if (lastOnly) {
              args.advance(1);
            }
            if (CheckPathParametersEx(ctx, cnt,
                                      lastOnly ? "GET_EXTENSION,LAST_ONLY"_s
                                               : "GET_EXTENSION"_s,
                                      args.size())) {
              if (args.front().empty()) {
                return std::string{};
              }
              return lastOnly
                ? cmCMakePath{ args.front() }.GetExtension().String()
                : cmCMakePath{ args.front() }.GetWideExtension().String();
            }
            return std::string{};
          } },
        { "GET_STEM"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            bool lastOnly = args.front() == "LAST_ONLY"_s;
            if (lastOnly) {
              args.advance(1);
            }
            if (CheckPathParametersEx(
                  ctx, cnt, lastOnly ? "GET_STEM,LAST_ONLY"_s : "GET_STEM"_s,
                  args.size())) {
              if (args.front().empty()) {
                return std::string{};
              }
              return lastOnly
                ? cmCMakePath{ args.front() }.GetStem().String()
                : cmCMakePath{ args.front() }.GetNarrowStem().String();
            }
            return std::string{};
          } },
        { "GET_RELATIVE_PART"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "GET_RELATIVE_PART"_s,
                                       args) &&
                !args.front().empty()
              ? cmCMakePath{ args.front() }.GetRelativePath().String()
              : std::string{};
          } },
        { "GET_PARENT_PATH"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "GET_PARENT_PATH"_s, args)
              ? cmCMakePath{ args.front() }.GetParentPath().String()
              : std::string{};
          } },
        { "HAS_ROOT_NAME"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "HAS_ROOT_NAME"_s, args)
              ? ToString(cmCMakePath{ args.front() }.HasRootName())
              : std::string{ "0" };
          } },
        { "HAS_ROOT_DIRECTORY"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "HAS_ROOT_DIRECTORY"_s, args)
              ? ToString(cmCMakePath{ args.front() }.HasRootDirectory())
              : std::string{ "0" };
          } },
        { "HAS_ROOT_PATH"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "HAS_ROOT_PATH"_s, args)
              ? ToString(cmCMakePath{ args.front() }.HasRootPath())
              : std::string{ "0" };
          } },
        { "HAS_FILENAME"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "HAS_FILENAME"_s, args)
              ? ToString(cmCMakePath{ args.front() }.HasFileName())
              : std::string{ "0" };
          } },
        { "HAS_EXTENSION"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "HAS_EXTENSION"_s, args) &&
                !args.front().empty()
              ? ToString(cmCMakePath{ args.front() }.HasExtension())
              : std::string{ "0" };
          } },
        { "HAS_STEM"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "HAS_STEM"_s, args)
              ? ToString(cmCMakePath{ args.front() }.HasStem())
              : std::string{ "0" };
          } },
        { "HAS_RELATIVE_PART"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "HAS_RELATIVE_PART"_s, args)
              ? ToString(cmCMakePath{ args.front() }.HasRelativePath())
              : std::string{ "0" };
          } },
        { "HAS_PARENT_PATH"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "HAS_PARENT_PATH"_s, args)
              ? ToString(cmCMakePath{ args.front() }.HasParentPath())
              : std::string{ "0" };
          } },
        { "IS_ABSOLUTE"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "IS_ABSOLUTE"_s, args)
              ? ToString(cmCMakePath{ args.front() }.IsAbsolute())
              : std::string{ "0" };
          } },
        { "IS_RELATIVE"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "IS_RELATIVE"_s, args)
              ? ToString(cmCMakePath{ args.front() }.IsRelative())
              : std::string{ "0" };
          } },
        { "IS_PREFIX"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            bool normalize = args.front() == "NORMALIZE"_s;
            if (normalize) {
              args.advance(1);
            }
            if (CheckPathParametersEx(ctx, cnt,
                                      normalize ? "IS_PREFIX,NORMALIZE"_s
                                                : "IS_PREFIX"_s,
                                      args.size(), 2)) {
              if (normalize) {
                return ToString(cmCMakePath{ args[0] }.Normal().IsPrefix(
                  cmCMakePath{ args[1] }.Normal()));
              }
              return ToString(
                cmCMakePath{ args[0] }.IsPrefix(cmCMakePath{ args[1] }));
            }
            return std::string{};
          } },
        { "CMAKE_PATH"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            bool normalize = args.front() == "NORMALIZE"_s;
            if (normalize) {
              args.advance(1);
            }
            if (CheckPathParametersEx(ctx, cnt,
                                      normalize ? "CMAKE_PATH,NORMALIZE"_s
                                                : "CMAKE_PATH"_s,
                                      args.size(), 1)) {
              auto path =
                cmCMakePath{ args.front(), cmCMakePath::auto_format };
              return normalize ? path.Normal().GenericString()
                               : path.GenericString();
            }
            return std::string{};
          } },
        { "APPEND"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            if (CheckPathParametersEx(ctx, cnt, "APPEND"_s, args.size(), 1,
                                      false)) {
              cmCMakePath path;
              for (const auto& p : args) {
                path /= p;
              }
              return path.String();
            }
            return std::string{};
          } },
        { "REMOVE_FILENAME"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "REMOVE_FILENAME"_s, args) &&
                !args.front().empty()
              ? cmCMakePath{ args.front() }.RemoveFileName().String()
              : std::string{};
          } },
        { "REPLACE_FILENAME"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "REPLACE_FILENAME"_s, args, 2)
              ? cmCMakePath{ args[0] }
                  .ReplaceFileName(cmCMakePath{ args[1] })
                  .String()
              : std::string{};
          } },
        { "REMOVE_EXTENSION"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            bool lastOnly = args.front() == "LAST_ONLY"_s;
            if (lastOnly) {
              args.advance(1);
            }
            if (CheckPathParametersEx(ctx, cnt,
                                      lastOnly ? "REMOVE_EXTENSION,LAST_ONLY"_s
                                               : "REMOVE_EXTENSION"_s,
                                      args.size())) {
              if (args.front().empty()) {
                return std::string{};
              }
              return lastOnly
                ? cmCMakePath{ args.front() }.RemoveExtension().String()
                : cmCMakePath{ args.front() }.RemoveWideExtension().String();
            }
            return std::string{};
          } },
        { "REPLACE_EXTENSION"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            bool lastOnly = args.front() == "LAST_ONLY"_s;
            if (lastOnly) {
              args.advance(1);
            }
            if (CheckPathParametersEx(ctx, cnt,
                                      lastOnly
                                        ? "REPLACE_EXTENSION,LAST_ONLY"_s
                                        : "REPLACE_EXTENSION"_s,
                                      args.size(), 2)) {
              if (lastOnly) {
                return cmCMakePath{ args[0] }
                  .ReplaceExtension(cmCMakePath{ args[1] })
                  .String();
              }
              return cmCMakePath{ args[0] }
                .ReplaceWideExtension(cmCMakePath{ args[1] })
                .String();
            }
            return std::string{};
          } },
        { "NORMAL_PATH"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "NORMAL_PATH"_s, args) &&
                !args.front().empty()
              ? cmCMakePath{ args.front() }.Normal().String()
              : std::string{};
          } },
        { "RELATIVE_PATH"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            return CheckPathParameters(ctx, cnt, "RELATIVE_PATH"_s, args, 2)
              ? cmCMakePath{ args[0] }.Relative(args[1]).String()
              : std::string{};
          } },
        { "ABSOLUTE_PATH"_s,
          [](cmGeneratorExpressionContext* ctx,
             const GeneratorExpressionContent* cnt,
             Arguments& args) -> std::string {
            bool normalize = args.front() == "NORMALIZE"_s;
            if (normalize) {
              args.advance(1);
            }
            if (CheckPathParametersEx(ctx, cnt,
                                      normalize ? "ABSOLUTE_PATH,NORMALIZE"_s
                                                : "ABSOLUTE_PATH"_s,
                                      args.size(), 2)) {
              auto path = cmCMakePath{ args[0] }.Absolute(args[1]);
              return normalize ? path.Normal().String() : path.String();
            }
            return std::string{};
          } }
      };

    if (cm::contains(pathCommands, parameters.front())) {
      auto args = Arguments{ parameters }.advance(1);
      return pathCommands[parameters.front()](context, content, args);
    }

    reportError(context, content->GetOriginalExpression(),
                cmStrCat(parameters.front(), ": invalid option."));
    return std::string{};
  }